

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O2

void m68k_op_lsl_16_ai(void)

{
  uint address;
  uint uVar1;
  uint value;
  
  address = m68ki_cpu.dar[(ulong)(m68ki_cpu.ir & 7) + 8];
  uVar1 = m68ki_read_16_fc(address,m68ki_address_space | m68ki_cpu.s_flag);
  value = uVar1 * 2 & 0xffff;
  m68ki_write_16_fc(address,m68ki_cpu.s_flag | 1,value);
  m68ki_cpu.n_flag = (uVar1 * 2 & 0xffff) >> 8;
  m68ki_cpu.not_z_flag = value;
  m68ki_cpu.c_flag = uVar1 >> 7;
  m68ki_cpu.x_flag = uVar1 >> 7;
  m68ki_cpu.v_flag = 0;
  return;
}

Assistant:

static void m68k_op_lsl_16_ai(void)
{
	uint ea = EA_AY_AI_16();
	uint src = m68ki_read_16(ea);
	uint res = MASK_OUT_ABOVE_16(src << 1);

	m68ki_write_16(ea, res);

	FLAG_N = NFLAG_16(res);
	FLAG_Z = res;
	FLAG_X = FLAG_C = src >> 7;
	FLAG_V = VFLAG_CLEAR;
}